

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O3

bool __thiscall
bssl::CertPathIter::GetNextPath
          (CertPathIter *this,ParsedCertificateList *out_certs,CertificateTrust *out_last_cert_trust
          ,CertPathErrors *out_errors,CertPathBuilderDelegate *delegate,uint32_t *iteration_count,
          uint32_t max_iteration_count,uint32_t max_path_building_depth)

{
  size_t *psVar1;
  pointer *ppuVar2;
  uint uVar3;
  pointer ppCVar4;
  TrustStore *pTVar5;
  unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
  *puVar6;
  tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
  tVar7;
  _Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> _Var8;
  ParsedCertificateList new_issuers;
  ParsedCertificateList new_issuers_00;
  pointer puVar9;
  vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
  *pvVar10;
  CertificateTrustType CVar11;
  int iVar12;
  CertificateTrustType CVar13;
  undefined8 *puVar14;
  size_t sVar15;
  _func_int **pp_Var16;
  undefined4 extraout_var;
  const_iterator cVar17;
  _Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
  *p_Var18;
  CertIssuersIter *pCVar19;
  ulong uVar20;
  pointer puVar21;
  long *plVar22;
  CertErrors *pCVar23;
  _Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> *p_Var24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  pointer pIVar26;
  undefined **ppuVar27;
  Request *pRVar28;
  ulong uVar29;
  undefined8 *puVar30;
  char *pcVar31;
  ParsedCertificate *cert;
  ParsedCertificate *extraout_RDX;
  ParsedCertificate *extraout_RDX_00;
  ParsedCertificate *extraout_RDX_01;
  ParsedCertificate *extraout_RDX_02;
  ParsedCertificate *pPVar32;
  ParsedCertificate *extraout_RDX_03;
  _Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> _Var33;
  pointer ppCVar34;
  unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
  *this_00;
  pointer puVar35;
  _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
  *this_01;
  pointer *__ptr;
  long lVar36;
  element_type *peVar37;
  undefined8 uVar38;
  pointer puVar39;
  pointer pIVar40;
  ulong uVar41;
  pointer pIVar42;
  CertificateTrust *pCVar43;
  bool bVar44;
  pair<std::_Rb_tree_iterator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_bool>
  pVar45;
  __uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
  _Var46;
  _Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> _Var47;
  __uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
  _Var48;
  pointer psVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  string local_100;
  CertIssuerIterPath *local_e0;
  _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
  *local_d8;
  vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
  *local_d0;
  CertPathErrors *local_c8;
  CertPathBuilderDelegate *local_c0;
  CertificateTrust *local_b8;
  _Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> local_b0;
  undefined1 local_a8 [24];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  pointer local_68;
  unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
  *local_60;
  CertificateTrust *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_50;
  CertIssuerSources *local_48;
  uint *local_40;
  _Base_ptr local_38;
  
  local_d0 = (vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
              *)out_certs;
  local_c8 = out_errors;
  local_40 = iteration_count;
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::clear(out_certs);
  out_last_cert_trust->type = UNSPECIFIED;
  out_last_cert_trust->enforce_anchor_expiry = false;
  out_last_cert_trust->enforce_anchor_constraints = false;
  out_last_cert_trust->require_anchor_basic_constraints = false;
  out_last_cert_trust->require_leaf_selfsigned = false;
  local_58 = out_last_cert_trust;
  iVar12 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
             [7])(delegate);
  if ((char)iVar12 == '\0') {
    local_e0 = &this->cur_path_;
    local_50 = &(this->next_issuer_).cert.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    pCVar43 = &(this->next_issuer_).trust;
    this_01 = (_Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
               *)&(this->cur_path_).present_certs_;
    local_38 = &(this->cur_path_).present_certs_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48 = &this->cert_issuer_sources_;
    local_d8 = this_01;
    local_c0 = delegate;
    local_b8 = pCVar43;
    while ((pvVar10 = local_d0, max_path_building_depth == 0 ||
           ((ulong)((long)(this->cur_path_).cur_path_.
                          super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->cur_path_).cur_path_.
                          super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <
            (ulong)max_path_building_depth))) {
      if ((this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        puVar21 = (this->cur_path_).cur_path_.
                  super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == puVar21) {
          iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar12 != '\0') {
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,0x23,"CertPathIter exhausted all paths...");
          }
          goto LAB_004ab379;
        }
        uVar3 = *local_40;
        *local_40 = uVar3 + 1;
        if (max_iteration_count < uVar3 + 1 && max_iteration_count != 0) {
          anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
          pCVar23 = CertPathErrors::GetOtherErrors(local_c8);
          ppuVar27 = &cert_errors::kIterationLimitExceeded;
          goto LAB_004ab36e;
        }
        pCVar19 = puVar21[-1]._M_t.
                  super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                  .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                  _M_head_impl;
        if (pCVar19->did_initial_query_ == false) {
          pCVar19->did_initial_query_ = true;
          ppCVar4 = (pCVar19->cert_issuer_sources_->
                    super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (ppCVar34 = (pCVar19->cert_issuer_sources_->
                          super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                          )._M_impl.super__Vector_impl_data._M_start; ppCVar34 != ppCVar4;
              ppCVar34 = ppCVar34 + 1) {
            _Var46._M_t.
            super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
            .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                 (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  )(_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                    )0x0;
            psVar49 = (pointer)0x0;
            uVar50 = 0;
            uVar51 = 0;
            (*(*ppCVar34)->_vptr_CertIssuerSource[2])
                      (*ppCVar34,
                       (pCVar19->cert_).
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&stack0xfffffffffffffec8);
            local_100.field_2._M_allocated_capacity = CONCAT44(uVar51,uVar50);
            new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_100._M_dataplus._M_p =
                 (pointer)_Var46._M_t.
                          super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                          .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                          _M_head_impl;
            local_100._M_string_length = (size_type)psVar49;
            anon_unknown_6::CertIssuersIter::AddIssuers(pCVar19,new_issuers);
            ::std::
            vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       *)&local_100);
            ::std::
            vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       *)&stack0xfffffffffffffec8);
          }
        }
        sVar15 = pCVar19->cur_issuer_;
        pIVar26 = (pCVar19->issuers_).
                  super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar42 = (pCVar19->issuers_).
                  super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar29 = (long)pIVar42 - (long)pIVar26 >> 5;
        this_01 = local_d8;
        if (uVar29 <= sVar15) {
          if (pCVar19->did_async_issuer_query_ == false) {
            pCVar19->did_async_issuer_query_ = true;
            pCVar19->cur_async_request_ = 0;
            ppCVar34 = (pCVar19->cert_issuer_sources_->
                       super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            ppCVar4 = (pCVar19->cert_issuer_sources_->
                      super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            delegate = local_c0;
            if (ppCVar34 != ppCVar4) {
              do {
                _Var47._M_head_impl = (Request *)0x0;
                (*(*ppCVar34)->_vptr_CertIssuerSource[3])
                          (*ppCVar34,
                           (pCVar19->cert_).
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&stack0xfffffffffffffec8);
                if (((_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)_Var47._M_head_impl
                     != (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)0x0) &&
                   (::std::
                    vector<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>,std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>>
                    ::
                    emplace_back<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>
                              ((vector<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>,std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>>
                                *)&pCVar19->pending_async_requests_,
                               (unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                *)&stack0xfffffffffffffec8),
                   (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                    )_Var47._M_head_impl != (Request *)0x0)) {
                  (**(code **)(*(long *)_Var47._M_head_impl + 8))();
                }
                ppCVar34 = ppCVar34 + 1;
              } while (ppCVar34 != ppCVar4);
              sVar15 = pCVar19->cur_issuer_;
              pIVar26 = (pCVar19->issuers_).
                        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pIVar42 = (pCVar19->issuers_).
                        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar29 = (long)pIVar42 - (long)pIVar26 >> 5;
              delegate = local_c0;
            }
          }
          this_01 = local_d8;
          if (uVar29 <= sVar15) {
            uVar20 = pCVar19->cur_async_request_;
            puVar39 = (pCVar19->pending_async_requests_).
                      super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (uVar20 < (ulong)((long)(pCVar19->pending_async_requests_).
                                       super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar39 >>
                                3)) {
              do {
                _Var47._M_head_impl = (Request *)0x0;
                _Var33._M_head_impl = (Request *)0x0;
                uVar50 = 0;
                uVar51 = 0;
                _Var46._M_t.
                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                     puVar39[uVar20]._M_t.
                     super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                     ._M_t;
                (**(code **)(*(long *)_Var46._M_t.
                                      super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                      .
                                      super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                      ._M_head_impl + 0x10))
                          (_Var46._M_t.
                           super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                           .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                           _M_head_impl,&stack0xfffffffffffffec8);
                if (_Var47._M_head_impl == _Var33._M_head_impl) {
                  sVar15 = pCVar19->cur_async_request_;
                  puVar39 = (pCVar19->pending_async_requests_).
                            super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pCVar19->cur_async_request_ = sVar15 + 1;
                  _Var46._M_t.
                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                       puVar39[sVar15]._M_t.
                       super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                       ._M_t;
                  puVar39[sVar15]._M_t.
                  super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  ._M_t = (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                           )0x0;
                  if ((_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                       )_Var46._M_t.
                        super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                        .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                        _M_head_impl != (Request *)0x0) {
                    (**(code **)(*(long *)_Var46._M_t.
                                          super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                          .
                                          super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                          ._M_head_impl + 8))();
                  }
                }
                else {
                  local_a8._16_8_ = CONCAT44(uVar51,uVar50);
                  new_issuers_00.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  new_issuers_00.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  new_issuers_00.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_a8._0_8_ = _Var47._M_head_impl;
                  local_a8._8_8_ = _Var33._M_head_impl;
                  anon_unknown_6::CertIssuersIter::AddIssuers(pCVar19,new_issuers_00);
                  ::std::
                  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                             *)local_a8);
                }
                ::std::
                vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                           *)&stack0xfffffffffffffec8);
                sVar15 = pCVar19->cur_issuer_;
                pIVar26 = (pCVar19->issuers_).
                          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pIVar42 = (pCVar19->issuers_).
                          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar29 = (long)pIVar42 - (long)pIVar26 >> 5;
                if (sVar15 < uVar29) break;
                uVar20 = pCVar19->cur_async_request_;
                puVar39 = (pCVar19->pending_async_requests_).
                          super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              } while (uVar20 < (ulong)((long)(pCVar19->pending_async_requests_).
                                              super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)puVar39 >> 3));
            }
            else {
              uVar29 = (long)pIVar42 - (long)pIVar26 >> 5;
            }
          }
        }
        pCVar43 = local_b8;
        if (sVar15 < uVar29) {
          if (pCVar19->issuers_needs_sort_ == true) {
            pIVar40 = pIVar26 + sVar15;
            if (pIVar40 != pIVar42) {
              lVar36 = (long)pIVar42 - (long)pIVar40 >> 5;
              uVar29 = (lVar36 - (lVar36 + 1 >> 0x3f)) + 1 >> 1;
              if (0 < lVar36) {
LAB_004aaa84:
                puVar14 = (undefined8 *)operator_new(uVar29 * 0x20,(nothrow_t *)&::std::nothrow);
                if (puVar14 == (undefined8 *)0x0) goto code_r0x004aaa9f;
                if (uVar29 != 0) {
                  peVar37 = (pIVar40->cert).
                            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  *puVar14 = peVar37;
                  p_Var25 = (pIVar40->cert).
                            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  puVar14[1] = p_Var25;
                  *(CertificateTrust *)(puVar14 + 2) = pIVar40->trust;
                  *(int *)(puVar14 + 3) = pIVar40->trust_and_key_id_match_ordering;
                  puVar30 = puVar14;
                  if (uVar29 != 1) {
                    lVar36 = uVar29 * 0x20 - 0x20;
                    do {
                      p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar30[1];
                      puVar30[4] = *puVar30;
                      puVar30[5] = p_Var25;
                      *puVar30 = 0;
                      puVar30[1] = 0;
                      puVar30[6] = puVar30[2];
                      *(undefined4 *)(puVar30 + 7) = *(undefined4 *)(puVar30 + 3);
                      puVar30 = puVar30 + 4;
                      lVar36 = lVar36 + -0x20;
                    } while (lVar36 != 0);
                    peVar37 = (element_type *)*puVar30;
                  }
                  *puVar30 = 0;
                  puVar30[1] = 0;
                  (pIVar40->cert).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = peVar37;
                  (pIVar40->cert).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = p_Var25;
                  pIVar40->trust_and_key_id_match_ordering = *(int *)(puVar30 + 3);
                  pIVar40->trust = *(CertificateTrust *)(puVar30 + 2);
                }
                ::std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry*,std::vector<bssl::(anonymous_namespace)::IssuerEntry,std::allocator<bssl::(anonymous_namespace)::IssuerEntry>>>,bssl::(anonymous_namespace)::IssuerEntry*,long,__gnu_cxx::__ops::_Iter_comp_iter<bssl::(anonymous_namespace)::CertIssuersIter::SortRemainingIssuers()::__0>>
                          (pIVar40,pIVar42,puVar14,uVar29);
                goto LAB_004aab94;
              }
LAB_004aaab0:
              ::std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry*,std::vector<bssl::(anonymous_namespace)::IssuerEntry,std::allocator<bssl::(anonymous_namespace)::IssuerEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<bssl::(anonymous_namespace)::CertIssuersIter::SortRemainingIssuers()::__0>>
                        (pIVar40,pIVar42);
LAB_004aab94:
              ::std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry_*,_std::vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>_>,_bssl::(anonymous_namespace)::IssuerEntry>
              ::~_Temporary_buffer
                        ((_Temporary_buffer<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry_*,_std::vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>_>,_bssl::(anonymous_namespace)::IssuerEntry>
                          *)&stack0xfffffffffffffec8);
              pIVar26 = (pCVar19->issuers_).
                        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar15 = pCVar19->cur_issuer_;
            }
            pCVar19->issuers_needs_sort_ = false;
            delegate = local_c0;
          }
          pCVar19->cur_issuer_ = sVar15 + 1;
          pIVar26 = pIVar26 + sVar15;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (pIVar26->cert).
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_50,&(pIVar26->cert).
                               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
          *local_b8 = pIVar26->trust;
          local_b8[1].type = pIVar26->trust_and_key_id_match_ordering;
          this_01 = local_d8;
          pCVar43 = local_b8;
        }
        else {
          p_Var25 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
          (this->next_issuer_).trust_and_key_id_match_ordering = 0;
        }
        pvVar10 = local_d0;
        if ((this->next_issuer_).cert.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) goto LAB_004aac02;
        pCVar19 = (this->cur_path_).cur_path_.
                  super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                  .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                  _M_head_impl;
        if ((ulong)((long)(pCVar19->issuers_).
                          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    *(long *)&(pCVar19->issuers_).
                              super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                              ._M_impl >> 5) <= pCVar19->skipped_issuer_count_) {
          anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
          pCVar23 = CertPathErrors::GetErrorsForCert
                              (local_c8,((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10 >> 4) -
                                        1);
          CertErrors::AddError(pCVar23,"No matching issuer found");
          iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar12 != '\0') {
            (anonymous_namespace)::PathDebugString_abi_cxx11_
                      (&local_100,*(_anonymous_namespace_ **)pvVar10,
                       *(ParsedCertificateList **)(pvVar10 + 8));
            plVar22 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_100,0,(char *)0x0,0x5998ed);
            pRVar28 = (Request *)(plVar22 + 2);
            if ((Request *)*plVar22 == pRVar28) {
              uVar50 = *(undefined4 *)&pRVar28->_vptr_Request;
              uVar51 = *(undefined4 *)((long)plVar22 + 0x14);
              _Var47._M_head_impl = (Request *)&stack0xfffffffffffffed8;
            }
            else {
              uVar50 = SUB84(pRVar28->_vptr_Request,0);
              uVar51 = (undefined4)((ulong)pRVar28->_vptr_Request >> 0x20);
              _Var47._M_head_impl = (Request *)*plVar22;
            }
            lVar36 = plVar22[1];
            *plVar22 = (long)pRVar28;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,lVar36,_Var47._M_head_impl);
            if (_Var47._M_head_impl != (Request *)&stack0xfffffffffffffed8) goto LAB_004ab664;
            goto LAB_004ab671;
          }
          goto LAB_004ab68d;
        }
        iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                   _vptr_VerifyCertificateChainDelegate[8])(delegate);
        if ((char)iVar12 != '\0') {
          (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9]
          )(delegate,0x1c,"CertPathIter backtracking...");
        }
        anon_unknown_6::CertIssuerIterPath::Pop(local_e0);
      }
      else {
LAB_004aac02:
        CVar13 = pCVar43->type;
        if (CVar13 != TRUSTED_LEAF) {
          if (CVar13 != LAST) {
            CVar11 = TRUSTED_ANCHOR_OR_LEAF;
            if (CVar13 - TRUSTED_ANCHOR_OR_LEAF < 2) goto LAB_004aace6;
            goto LAB_004aad27;
          }
          if ((this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate[8])(delegate);
            if ((char)iVar12 != '\0') {
              pp_Var16 = (delegate->super_VerifyCertificateChainDelegate).
                         _vptr_VerifyCertificateChainDelegate;
              uVar38 = 0x32;
              pcVar31 = "Leaf is a trust anchor, considering as UNSPECIFIED";
              goto LAB_004aac6f;
            }
            goto LAB_004aac72;
          }
LAB_004ab380:
          pvVar10 = local_d0;
          anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
          ::std::
          vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
          ::emplace_back<std::shared_ptr<bssl::ParsedCertificate_const>>
                    (pvVar10,(shared_ptr<const_bssl::ParsedCertificate> *)this);
          iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar12 != '\0') {
            (anonymous_namespace)::PathDebugString_abi_cxx11_
                      (&local_100,*(_anonymous_namespace_ **)pvVar10,
                       *(ParsedCertificateList **)(pvVar10 + 8));
            p_Var24 = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> *)
                      ::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x599a07);
            _Var47._M_head_impl = (Request *)(p_Var24 + 2);
            if (p_Var24->_M_head_impl == _Var47._M_head_impl) {
              uVar50 = *(undefined4 *)&(_Var47._M_head_impl)->_vptr_Request;
              uVar51 = *(undefined4 *)((long)&p_Var24[2]._M_head_impl + 4);
              _Var33._M_head_impl = (Request *)&stack0xfffffffffffffed8;
            }
            else {
              uVar50 = SUB84((_Var47._M_head_impl)->_vptr_Request,0);
              uVar51 = (undefined4)((ulong)(_Var47._M_head_impl)->_vptr_Request >> 0x20);
              _Var33._M_head_impl = p_Var24->_M_head_impl;
            }
            _Var8._M_head_impl = p_Var24[1]._M_head_impl;
            p_Var24->_M_head_impl = _Var47._M_head_impl;
            p_Var24[1]._M_head_impl = (Request *)0x0;
            *(undefined1 *)&p_Var24[2]._M_head_impl = 0;
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,_Var8._M_head_impl,_Var33._M_head_impl);
            if (_Var33._M_head_impl != (Request *)&stack0xfffffffffffffed8) {
              operator_delete(_Var33._M_head_impl,CONCAT44(uVar51,uVar50) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
          }
          *local_58 = (this->next_issuer_).trust;
          p_Var25 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
          (this->next_issuer_).trust_and_key_id_match_ordering = 0;
          goto LAB_004ab697;
        }
        if ((this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          CVar11 = TRUSTED_LEAF;
LAB_004aace6:
          CVar13 = CVar11;
          if (((this->cur_path_).cur_path_.
               super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->cur_path_).cur_path_.
               super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((this->next_issuer_).trust.require_leaf_selfsigned == true)) {
            pPVar32 = (this->next_issuer_).cert.
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate[2])(delegate);
            bVar44 = VerifyCertificateIsSelfSigned
                               (pPVar32,(SignatureVerifyCache *)CONCAT44(extraout_var,iVar12),
                                (CertErrors *)0x0);
            if (!bVar44) {
              iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                         _vptr_VerifyCertificateChainDelegate[8])(delegate);
              this_01 = local_d8;
              if ((char)iVar12 != '\0') {
                pp_Var16 = (delegate->super_VerifyCertificateChainDelegate).
                           _vptr_VerifyCertificateChainDelegate;
                uVar38 = 0x5f;
                pcVar31 = 
                "Leaf is trusted with require_leaf_selfsigned but is not self-signed, considering as UNSPECIFIED"
                ;
                goto LAB_004aac6f;
              }
              goto LAB_004aac72;
            }
            CVar13 = pCVar43->type;
            this_01 = local_d8;
          }
LAB_004aad27:
          if (CVar13 != UNSPECIFIED) {
            if ((2 < CVar13 - LAST) && (CVar13 != DISTRUSTED)) goto LAB_004ab276;
            goto LAB_004ab380;
          }
        }
        else {
          iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar12 != '\0') {
            pp_Var16 = (delegate->super_VerifyCertificateChainDelegate).
                       _vptr_VerifyCertificateChainDelegate;
            uVar38 = 0x32;
            pcVar31 = "Issuer is a trust leaf, considering as UNSPECIFIED";
LAB_004aac6f:
            (*pp_Var16[9])(delegate,uVar38,pcVar31);
          }
LAB_004aac72:
          pCVar43->type = UNSPECIFIED;
          pCVar43->enforce_anchor_expiry = false;
          pCVar43->enforce_anchor_constraints = false;
          pCVar43->require_anchor_basic_constraints = false;
          pCVar43->require_leaf_selfsigned = false;
        }
        cVar17 = ::std::
                 _Rb_tree<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Identity<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::find((_Rb_tree<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Identity<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)this_01,(key_type *)&stack0xfffffffffffffec8);
        if (cVar17._M_node == local_38) {
          pCVar19 = (CertIssuersIter *)operator_new(0xb0);
          peVar37 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var25 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pTVar5 = this->trust_store_;
          (pCVar19->cert_).
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar37;
          (pCVar19->cert_).
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var25;
          pCVar19->cert_issuer_sources_ = local_48;
          pCVar19->trust_store_ = pTVar5;
          (pCVar19->issuers_).
          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pCVar19->issuers_).
          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pCVar19->issuers_).
          super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pCVar19->cur_issuer_ = 0;
          *(undefined8 *)((long)&pCVar19->cur_issuer_ + 1) = 0;
          *(undefined8 *)((long)&pCVar19->skipped_issuer_count_ + 1) = 0;
          (pCVar19->present_issuers_)._M_h._M_buckets =
               &(pCVar19->present_issuers_)._M_h._M_single_bucket;
          (pCVar19->present_issuers_)._M_h._M_bucket_count = 1;
          (pCVar19->present_issuers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pCVar19->present_issuers_)._M_h._M_element_count = 0;
          (pCVar19->present_issuers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (pCVar19->present_issuers_)._M_h._M_rehash_policy._M_next_resize = 0;
          (pCVar19->present_issuers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          pCVar19->did_initial_query_ = false;
          pCVar19->did_async_issuer_query_ = false;
          pCVar19->cur_async_request_ = 0;
          (pCVar19->pending_async_requests_).
          super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pCVar19->pending_async_requests_).
          super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pCVar19->pending_async_requests_).
          super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_b0._M_head_impl = pCVar19;
          pVar45 = ::std::
                   _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
                   ::
                   _M_insert_unique<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>
                             (this_01,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&stack0xfffffffffffffec8);
          if (((undefined1  [16])pVar45 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            abort();
          }
          puVar6 = (this->cur_path_).cur_path_.
                   super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (puVar6 == (this->cur_path_).cur_path_.
                        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_00 = (local_e0->cur_path_).
                      super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar36 = (long)puVar6 - (long)this_00;
            if (lVar36 == 0x7ffffffffffffff8) {
              ::std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar20 = lVar36 >> 3;
            uVar29 = uVar20;
            if (puVar6 == this_00) {
              uVar29 = 1;
            }
            uVar41 = uVar29 + uVar20;
            if (0xffffffffffffffe < uVar41) {
              uVar41 = 0xfffffffffffffff;
            }
            if (CARRY8(uVar29,uVar20)) {
              uVar41 = 0xfffffffffffffff;
            }
            puVar21 = (pointer)operator_new(uVar41 * 8);
            *(CertIssuersIter **)((long)puVar21 + lVar36) = pCVar19;
            local_b0._M_head_impl = (CertIssuersIter *)0x0;
            local_60 = this_00;
            local_68 = puVar21;
            for (; puVar6 != this_00; this_00 = this_00 + 1) {
              (puVar21->_M_t).
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              ._M_t = (tuple<bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                       )(this_00->_M_t).
                        super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                        .
                        super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                        ._M_head_impl;
              (this_00->_M_t).
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
              _M_head_impl = (CertIssuersIter *)0x0;
              ::std::
              unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              ::~unique_ptr(this_00);
              puVar21 = puVar21 + 1;
            }
            if (local_60 !=
                (unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 *)0x0) {
              operator_delete(local_60,(long)(this->cur_path_).cur_path_.
                                             super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)local_60);
            }
            (this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_68;
            (this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = puVar21 + 1;
            (this->cur_path_).cur_path_.
            super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68 + uVar41;
          }
          else {
            (puVar6->_M_t).
            super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
            ._M_t.
            super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
            .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
            _M_head_impl = pCVar19;
            local_b0._M_head_impl = (CertIssuersIter *)0x0;
            ppuVar2 = &(this->cur_path_).cur_path_.
                       super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppuVar2 = *ppuVar2 + 1;
          }
          this_01 = local_d8;
          ::std::
          unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
          ::~unique_ptr((unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                         *)&local_b0);
          pCVar43 = local_b8;
          delegate = local_c0;
          p_Var25 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
          (this->next_issuer_).trust_and_key_id_match_ordering = 0;
          iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar12 != '\0') {
            puVar21 = (this->cur_path_).cur_path_.
                      super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_88 = &local_78;
            local_80 = 0;
            local_78 = 0;
            puVar9 = (this->cur_path_).cur_path_.
                     super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar32 = extraout_RDX;
            while (puVar9 != puVar21) {
              puVar35 = puVar9 + 1;
              if (local_80 != 0) {
                ::std::__cxx11::string::append((char *)&local_88);
                pPVar32 = extraout_RDX_00;
              }
              (anonymous_namespace)::CertDebugString_abi_cxx11_
                        (&local_100,
                         *(_anonymous_namespace_ **)
                          &(((puVar9->_M_t).
                             super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                             .
                             super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                            ._M_head_impl)->cert_).
                           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ,pPVar32);
              p_Var18 = (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                         *)::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x59604a)
              ;
              _Var46._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                   (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                    )(p_Var18 + 2);
              if ((tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   )p_Var18->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> ==
                  (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   )_Var46._M_t.
                    super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                    .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl) {
                uVar50 = (undefined4)
                         *(long *)_Var46._M_t.
                                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                  .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                                  _M_head_impl;
                uVar51 = (undefined4)
                         ((ulong)*(long *)_Var46._M_t.
                                          super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                          .
                                          super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                          ._M_head_impl >> 0x20);
                _Var48._M_t.
                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                     (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                      )(tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                        )&stack0xfffffffffffffed8;
              }
              else {
                uVar50 = (undefined4)
                         *(long *)_Var46._M_t.
                                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                  .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                                  _M_head_impl;
                uVar51 = (undefined4)
                         ((ulong)*(long *)_Var46._M_t.
                                          super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                          .
                                          super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                          ._M_head_impl >> 0x20);
                _Var48._M_t.
                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                     (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                      )(_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                        )p_Var18->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>;
              }
              p_Var18->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> =
                   (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)
                   _Var46._M_t.
                   super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl;
              p_Var18[1].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> =
                   (Request *)0x0;
              *(undefined1 *)
               &p_Var18[2].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> = 0;
              ::std::__cxx11::string::_M_append
                        ((char *)&local_88,
                         (ulong)_Var48._M_t.
                                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                                _M_head_impl);
              pPVar32 = extraout_RDX_01;
              if (_Var48._M_t.
                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl !=
                  (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   )&stack0xfffffffffffffed8) {
                operator_delete((void *)_Var48._M_t.
                                        super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                        .
                                        super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                        ._M_head_impl,CONCAT44(uVar51,uVar50) + 1);
                pPVar32 = extraout_RDX_02;
              }
              puVar9 = puVar35;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
                pPVar32 = extraout_RDX_03;
              }
            }
            plVar22 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_88,0,(char *)0x0,0x599a47);
            pCVar43 = local_b8;
            this_01 = local_d8;
            local_a8._0_8_ = local_a8 + 0x10;
            psVar49 = (pointer)(plVar22 + 2);
            if ((pointer)*plVar22 == psVar49) {
              local_a8._16_8_ =
                   (psVar49->
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              uStack_90 = (undefined4)plVar22[3];
              uStack_8c = *(undefined4 *)((long)plVar22 + 0x1c);
            }
            else {
              local_a8._16_8_ =
                   (psVar49->
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              local_a8._0_8_ = (pointer)*plVar22;
            }
            local_a8._8_8_ = plVar22[1];
            *plVar22 = (long)psVar49;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,local_a8._8_8_,local_a8._0_8_);
            if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
              operator_delete((void *)local_a8._0_8_,
                              (ulong)((long)&(((UniquePtr<CRYPTO_BUFFER> *)local_a8._16_8_)->_M_t).
                                             super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                             _M_head_impl + 1));
            }
            if (local_88 != &local_78) {
              operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
            }
          }
        }
        else {
          psVar1 = &((this->cur_path_).cur_path_.
                     super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                     super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                     .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                    _M_head_impl)->skipped_issuer_count_;
          *psVar1 = *psVar1 + 1;
          iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate[8])(delegate);
          if ((char)iVar12 != '\0') {
            (anonymous_namespace)::CertDebugString_abi_cxx11_
                      (&local_100,
                       (_anonymous_namespace_ *)
                       (this->next_issuer_).cert.
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,cert);
            p_Var18 = (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                       *)::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x599a25);
            _Var46._M_t.
            super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
            .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                 (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  )(p_Var18 + 2);
            if ((tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                 )p_Var18->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> ==
                (_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                 )_Var46._M_t.
                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                  .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl) {
              uVar50 = *(undefined4 *)
                        _Var46._M_t.
                        super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                        .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                        _M_head_impl;
              uVar51 = *(undefined4 *)
                        ((long)&p_Var18[2].
                                super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                                _M_head_impl + 4);
              _Var48._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                   (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                    )(tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                      )&stack0xfffffffffffffed8;
            }
            else {
              uVar50 = (undefined4)
                       *(long *)_Var46._M_t.
                                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                                _M_head_impl;
              uVar51 = (undefined4)
                       ((ulong)*(long *)_Var46._M_t.
                                        super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                        .
                                        super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                        ._M_head_impl >> 0x20);
              _Var48._M_t.
              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                   (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                    )(_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                      )p_Var18->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>;
            }
            tVar7.
            super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
            .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
                 *(_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   *)&p_Var18[1].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>;
            p_Var18->super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> =
                 (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>)
                 _Var46._M_t.
                 super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                 .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl;
            p_Var18[1].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> =
                 (Request *)0x0;
            *(undefined1 *)
             &p_Var18[2].super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> = 0;
            (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
              [9])(delegate,tVar7.
                            super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                            .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                            _M_head_impl,
                   _Var48._M_t.
                   super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl);
            if (_Var48._M_t.
                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl !=
                (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                 )&stack0xfffffffffffffed8) {
              operator_delete((void *)_Var48._M_t.
                                      super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                      .
                                      super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>
                                      ._M_head_impl,CONCAT44(uVar51,uVar50) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
          }
          p_Var25 = (this->next_issuer_).cert.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          (this->next_issuer_).trust.type = UNSPECIFIED;
          (this->next_issuer_).trust.enforce_anchor_expiry = false;
          (this->next_issuer_).trust.enforce_anchor_constraints = false;
          (this->next_issuer_).trust.require_anchor_basic_constraints = false;
          (this->next_issuer_).trust.require_leaf_selfsigned = false;
          (this->next_issuer_).trust_and_key_id_match_ordering = 0;
        }
      }
LAB_004ab276:
      iVar12 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[7])(delegate);
      if ((char)iVar12 != '\0') goto LAB_004aa6cd;
    }
    anon_unknown_6::CertIssuerIterPath::CopyPath(local_e0,(ParsedCertificateList *)local_d0);
    pCVar23 = CertPathErrors::GetOtherErrors(local_c8);
    CertErrors::AddError(pCVar23,"Depth limit exceeded");
    iVar12 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
               [8])(delegate);
    if ((char)iVar12 != '\0') {
      (anonymous_namespace)::PathDebugString_abi_cxx11_
                (&local_100,*(_anonymous_namespace_ **)pvVar10,
                 *(ParsedCertificateList **)(pvVar10 + 8));
      p_Var24 = (_Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false> *)
                ::std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x59987d);
      _Var33._M_head_impl = (Request *)(p_Var24 + 2);
      if (p_Var24->_M_head_impl == _Var33._M_head_impl) {
        uVar50 = *(undefined4 *)&(_Var33._M_head_impl)->_vptr_Request;
        uVar51 = *(undefined4 *)((long)&p_Var24[2]._M_head_impl + 4);
        _Var47._M_head_impl = (Request *)&stack0xfffffffffffffed8;
      }
      else {
        uVar50 = SUB84((_Var33._M_head_impl)->_vptr_Request,0);
        uVar51 = (undefined4)((ulong)(_Var33._M_head_impl)->_vptr_Request >> 0x20);
        _Var47._M_head_impl = p_Var24->_M_head_impl;
      }
      _Var8._M_head_impl = p_Var24[1]._M_head_impl;
      p_Var24->_M_head_impl = _Var33._M_head_impl;
      p_Var24[1]._M_head_impl = (Request *)0x0;
      *(undefined1 *)&p_Var24[2]._M_head_impl = 0;
      (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                (delegate,_Var8._M_head_impl,_Var47._M_head_impl);
      if (_Var47._M_head_impl != (Request *)&stack0xfffffffffffffed8) {
LAB_004ab664:
        operator_delete(_Var47._M_head_impl,CONCAT44(uVar51,uVar50) + 1);
      }
LAB_004ab671:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
LAB_004ab68d:
    anon_unknown_6::CertIssuerIterPath::Pop(local_e0);
LAB_004ab697:
    bVar44 = true;
  }
  else {
LAB_004aa6cd:
    if ((this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::
        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ::push_back((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     *)local_d0,(value_type *)this);
      }
    }
    else {
      anon_unknown_6::CertIssuerIterPath::CopyPath
                (&this->cur_path_,(ParsedCertificateList *)local_d0);
    }
    pCVar23 = CertPathErrors::GetOtherErrors(local_c8);
    ppuVar27 = &cert_errors::kDeadlineExceeded;
LAB_004ab36e:
    CertErrors::AddError(pCVar23,*ppuVar27);
LAB_004ab379:
    bVar44 = false;
  }
  return bVar44;
code_r0x004aaa9f:
  bVar44 = uVar29 < 2;
  uVar29 = uVar29 + 1 >> 1;
  if (bVar44) goto LAB_004aaab0;
  goto LAB_004aaa84;
}

Assistant:

bool CertPathIter::GetNextPath(ParsedCertificateList *out_certs,
                               CertificateTrust *out_last_cert_trust,
                               CertPathErrors *out_errors,
                               CertPathBuilderDelegate *delegate,
                               uint32_t *iteration_count,
                               const uint32_t max_iteration_count,
                               const uint32_t max_path_building_depth) {
  out_certs->clear();
  *out_last_cert_trust = CertificateTrust::ForUnspecified();

  while (true) {
    if (delegate->IsDeadlineExpired()) {
      if (cur_path_.Empty()) {
        // If the deadline is already expired before the first call to
        // GetNextPath, cur_path_ will be empty. Return the leaf cert in that
        // case.
        if (next_issuer_.cert) {
          out_certs->push_back(next_issuer_.cert);
        }
      } else {
        cur_path_.CopyPath(out_certs);
      }
      out_errors->GetOtherErrors()->AddError(cert_errors::kDeadlineExceeded);
      return false;
    }

    // We are not done yet, so if the current path is at the depth limit then
    // we must backtrack to find an acceptable solution.
    if (max_path_building_depth > 0 &&
        cur_path_.Length() >= max_path_building_depth) {
      cur_path_.CopyPath(out_certs);
      out_errors->GetOtherErrors()->AddError(cert_errors::kDepthLimitExceeded);
      if (delegate->IsDebugLogEnabled()) {
        delegate->DebugLog(
            "CertPathIter reached depth limit. Returning "
            "partial path and backtracking:\n" +
            PathDebugString(*out_certs));
      }
      cur_path_.Pop();
      return true;
    }

    if (!next_issuer_.cert) {
      if (cur_path_.Empty()) {
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter exhausted all paths...");
        }
        return false;
      }

      (*iteration_count)++;
      if (max_iteration_count > 0 && *iteration_count > max_iteration_count) {
        cur_path_.CopyPath(out_certs);
        out_errors->GetOtherErrors()->AddError(
            cert_errors::kIterationLimitExceeded);
        return false;
      }

      cur_path_.back()->GetNextIssuer(&next_issuer_);
      if (!next_issuer_.cert) {
        if (!cur_path_.back()->had_non_skipped_issuers()) {
          // If the end of a path was reached without finding an anchor, return
          // the partial path before backtracking.
          cur_path_.CopyPath(out_certs);
          out_errors->GetErrorsForCert(out_certs->size() - 1)
              ->AddError(cert_errors::kNoIssuersFound);
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "CertPathIter returning partial path and backtracking:\n" +
                PathDebugString(*out_certs));
          }
          cur_path_.Pop();
          return true;
        } else {
          // No more issuers for current chain, go back up and see if there are
          // any more for the previous cert.
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter backtracking...");
          }
          cur_path_.Pop();
          continue;
        }
      }
    }

    // Overrides for cert with trust appearing in the wrong place for the type
    // of trust (trusted leaf in non-leaf position, or trust anchor in leaf
    // position.)
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_ANCHOR:
        // If the leaf cert is trusted only as an anchor, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // different root (or to the same cert if it's self-signed).
        if (cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is a trust anchor, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_LEAF:
        // If a non-leaf cert is trusted only as a leaf, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // trusted root.
        if (!cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Issuer is a trust leaf, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        // No override necessary.
        break;
    }

    // Overrides for trusted leaf cert with require_leaf_selfsigned. If the leaf
    // isn't actually self-signed, treat it as unspecified.
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_LEAF:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        if (cur_path_.Empty() && next_issuer_.trust.require_leaf_selfsigned &&
            !VerifyCertificateIsSelfSigned(*next_issuer_.cert,
                                           delegate->GetVerifyCache(),
                                           /*errors=*/nullptr)) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is trusted with require_leaf_selfsigned but is "
                "not self-signed, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
        // No override necessary.
        break;
    }

    switch (next_issuer_.trust.type) {
      // If the trust for this issuer is "known" (either because it is
      // distrusted, or because it is trusted) then stop building and return the
      // path.
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
      case CertificateTrustType::TRUSTED_LEAF: {
        // If the issuer has a known trust level, can stop building the path.
        cur_path_.CopyPath(out_certs);
        out_certs->push_back(std::move(next_issuer_.cert));
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter returning path:\n" +
                             PathDebugString(*out_certs));
        }
        *out_last_cert_trust = next_issuer_.trust;
        next_issuer_ = IssuerEntry();
        return true;
      }
      case CertificateTrustType::UNSPECIFIED: {
        // Skip this cert if it is already in the chain.
        if (cur_path_.IsPresent(next_issuer_.cert.get())) {
          cur_path_.back()->increment_skipped_issuer_count();
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter skipping dupe cert: " +
                               CertDebugString(next_issuer_.cert.get()));
          }
          next_issuer_ = IssuerEntry();
          continue;
        }

        cur_path_.Append(std::make_unique<CertIssuersIter>(
            std::move(next_issuer_.cert), &cert_issuer_sources_, trust_store_));
        next_issuer_ = IssuerEntry();
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter cur_path_ =\n" +
                             cur_path_.PathDebugString());
        }
        // Continue descending the tree.
        continue;
      }
    }
  }
}